

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void __thiscall Rml::DataParser::Error(DataParser *this,String *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  String cursor_string;
  
  this->parse_error = true;
  Log::Message(LT_WARNING,"Error in data expression at %zu. %s",this->index,
               (message->_M_dataplus)._M_p);
  Log::Message(LT_WARNING,"  \"%s\"",(this->expression)._M_dataplus._M_p);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->index + '\x03');
  ::std::operator+(&cursor_string,&local_50,'^');
  ::std::__cxx11::string::~string((string *)&local_50);
  Log::Message(LT_WARNING,"%s",cursor_string._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&cursor_string);
  return;
}

Assistant:

void Error(const String& message)
	{
		parse_error = true;
		Log::Message(Log::LT_WARNING, "Error in data expression at %zu. %s", index, message.c_str());
		Log::Message(Log::LT_WARNING, "  \"%s\"", expression.c_str());

		const size_t cursor_offset = size_t(index) + 3;
		const String cursor_string = String(cursor_offset, ' ') + '^';
		Log::Message(Log::LT_WARNING, "%s", cursor_string.c_str());
	}